

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeUtilsTest.cpp
# Opt level: O1

void __thiscall TimeUtilsTest::test1(TimeUtilsTest *this)

{
  timeval tv;
  timeval tv_1;
  timeval local_30;
  timeval local_20;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  if (local_30.tv_sec == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timeUtilsTest.cpp"
               ,0x5c,"Cur time with timeval is 0");
  }
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  if (local_20.tv_sec != 0) {
    return;
  }
  TestCase::TestFailedInternal
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timeUtilsTest.cpp"
             ,99,"Cur time with timespec is 0");
  return;
}

Assistant:

void TimeUtilsTest::test1()
{
	struct timeval tv;
	
	TimeUtils::getCurTime( &tv );
	
	if ( tv.tv_sec == 0 )
		TestFailed( "Cur time with timeval is 0" );
	
	struct timespec ts;
	
	TimeUtils::getCurTime( &ts );
	
	if ( ts.tv_sec == 0 )
		TestFailed( "Cur time with timespec is 0" );
}